

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool google::protobuf::compiler::anon_unknown_0::IsMessageSetWireFormatMessage
               (DescriptorProto *message)

{
  int iVar1;
  Type *pTVar2;
  int index;
  MessageOptions *p;
  
  if (message == (DescriptorProto *)0x0) {
    message = (DescriptorProto *)_MessageOptions_default_instance_;
  }
  index = 0;
  if (0 < (message->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar2 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                         (&(message->nested_type_).super_RepeatedPtrFieldBase,index);
      if ((pTVar2->name_).super_RepeatedPtrFieldBase.current_size_ == 1) {
        iVar1 = std::__cxx11::string::compare
                          ((char *)(*(ulong *)((long)((pTVar2->name_).super_RepeatedPtrFieldBase.
                                                     rep_)->elements[0] + 0x18) & 0xfffffffffffffffe
                                   ));
        if (iVar1 == 0) {
          iVar1 = std::__cxx11::string::compare
                            ((char *)((ulong)(pTVar2->identifier_value_).tagged_ptr_.ptr_ &
                                     0xfffffffffffffffe));
          if (iVar1 == 0) {
            index = 1;
            goto LAB_00340ff5;
          }
        }
      }
      index = index + 1;
    } while (index < (message->nested_type_).super_RepeatedPtrFieldBase.current_size_);
    index = 0;
  }
LAB_00340ff5:
  return SUB41(index,0);
}

Assistant:

bool IsMessageSetWireFormatMessage(const DescriptorProto& message) {
  const MessageOptions& options = message.options();
  for (int i = 0; i < options.uninterpreted_option_size(); ++i) {
    const UninterpretedOption& uninterpreted = options.uninterpreted_option(i);
    if (uninterpreted.name_size() == 1 &&
        uninterpreted.name(0).name_part() == "message_set_wire_format" &&
        uninterpreted.identifier_value() == "true") {
      return true;
    }
  }
  return false;
}